

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<QListViewItem>::emplace<QListViewItem_const&>
          (QPodArrayOps<QListViewItem> *this,qsizetype i,QListViewItem *args)

{
  QListViewItem **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  int iVar4;
  int iVar5;
  short sVar6;
  short sVar7;
  int iVar8;
  uint uVar9;
  QListViewItem *pQVar10;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QListViewItem>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_00579ab0:
    iVar8 = args->indexHint;
    uVar9 = args->visited;
    sVar6 = args->w;
    sVar7 = args->h;
    iVar4 = args->x;
    iVar5 = args->y;
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QListViewItem>).size != 0);
    QArrayDataPointer<QListViewItem>::detachAndGrow
              (&this->super_QArrayDataPointer<QListViewItem>,where,1,(QListViewItem **)0x0,
               (QArrayDataPointer<QListViewItem> *)0x0);
    pQVar10 = createHole(this,where,i,1);
    pQVar10->x = iVar4;
    pQVar10->y = iVar5;
    pQVar10->w = sVar6;
    pQVar10->h = sVar7;
    pQVar10->indexHint = iVar8;
    pQVar10->visited = uVar9;
  }
  else {
    if (((this->super_QArrayDataPointer<QListViewItem>).size == i) &&
       (pQVar10 = (this->super_QArrayDataPointer<QListViewItem>).ptr,
       (pDVar3->super_QArrayData).alloc - i !=
       ((long)((long)pQVar10 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 2) *
       -0x3333333333333333)) {
      pQVar10[i].visited = args->visited;
      iVar4 = args->y;
      sVar6 = args->w;
      sVar7 = args->h;
      iVar5 = args->indexHint;
      pQVar10 = pQVar10 + i;
      pQVar10->x = args->x;
      pQVar10->y = iVar4;
      pQVar10->w = sVar6;
      pQVar10->h = sVar7;
      pQVar10->indexHint = iVar5;
    }
    else {
      if ((i != 0) ||
         (pQVar10 = (this->super_QArrayDataPointer<QListViewItem>).ptr,
         (QListViewItem *)
         ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) == pQVar10))
      goto LAB_00579ab0;
      pQVar10[-1].visited = args->visited;
      iVar4 = args->y;
      sVar6 = args->w;
      sVar7 = args->h;
      iVar5 = args->indexHint;
      pQVar10[-1].x = args->x;
      pQVar10[-1].y = iVar4;
      pQVar10[-1].w = sVar6;
      pQVar10[-1].h = sVar7;
      pQVar10[-1].indexHint = iVar5;
      ppQVar1 = &(this->super_QArrayDataPointer<QListViewItem>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QListViewItem>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }